

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::ImageSampleInstanceImages
          (ImageSampleInstanceImages *this,DeviceInterface *vki,VkDevice device,
          deUint32 queueFamilyIndex,VkQueue queue,Allocator *allocator,
          VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          VkImageViewType viewType,deUint32 baseMipLevel,deUint32 baseArraySlice,bool immutable)

{
  TextureFormat *format;
  Handle<(vk::HandleType)20> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  deUint32 dVar5;
  RefBase<vk::Handle<(vk::HandleType)20>_> local_78;
  deUint64 local_58;
  DeviceInterface *pDStack_50;
  VkDevice local_48;
  VkAllocationCallbacks *pVStack_40;
  
  if (descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    dVar5 = 1;
  }
  else if (descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    dVar5 = getInterfaceNumResources(shaderInterface);
  }
  else {
    dVar5 = 0;
  }
  ImageInstanceImages::ImageInstanceImages
            (&this->super_ImageInstanceImages,vki,device,queueFamilyIndex,queue,allocator,
             descriptorType,viewType,dVar5,baseMipLevel,baseArraySlice);
  this->m_descriptorType = descriptorType;
  this->m_shaderInterface = shaderInterface;
  this->m_isImmutable = immutable;
  createRefSampler(&this->m_refSamplerA,true);
  (this->m_refSamplerB).wrapS = CLAMP_TO_EDGE;
  (this->m_refSamplerB).wrapT = CLAMP_TO_EDGE;
  (this->m_refSamplerB).wrapR = CLAMP_TO_EDGE;
  (this->m_refSamplerB).minFilter = NEAREST;
  (this->m_refSamplerB).magFilter = NEAREST;
  (this->m_refSamplerB).lodThreshold = 0.0;
  (this->m_refSamplerB).normalizedCoords = true;
  (this->m_refSamplerB).depthStencilMode = MODE_DEPTH;
  (this->m_refSamplerB).compare = COMPAREMODE_NONE;
  (this->m_refSamplerB).compareChannel = 0;
  *(undefined8 *)&(this->m_refSamplerB).borderColor.v = 0;
  *(undefined8 *)((long)&(this->m_refSamplerB).borderColor.v + 1) = 0;
  *(undefined8 *)((long)&(this->m_refSamplerB).borderColor.v + 9) = 0;
  format = &(this->super_ImageInstanceImages).m_imageFormat;
  createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&local_78,vki,device,&this->m_refSamplerA,
                format);
  pVVar4 = local_78.m_data.deleter.m_allocator;
  pVVar3 = local_78.m_data.deleter.m_device;
  pDVar2 = local_78.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_78.m_data.object.m_internal;
  local_48 = local_78.m_data.deleter.m_device;
  pVStack_40 = local_78.m_data.deleter.m_allocator;
  local_58 = local_78.m_data.object.m_internal;
  pDStack_50 = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = pVVar3
  ;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       pDVar2;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&local_78);
  dVar5 = getInterfaceNumResources(this->m_shaderInterface);
  if (dVar5 == 1) {
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  }
  else {
    createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&local_78,vki,device,&this->m_refSamplerB
                  ,format);
  }
  pVVar4 = local_78.m_data.deleter.m_allocator;
  pVVar3 = local_78.m_data.deleter.m_device;
  pDVar2 = local_78.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_78.m_data.object.m_internal;
  local_48 = local_78.m_data.deleter.m_device;
  pVStack_40 = local_78.m_data.deleter.m_allocator;
  local_58 = local_78.m_data.object.m_internal;
  pDStack_50 = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = pVVar3
  ;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       pDVar2;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&local_78);
  return;
}

Assistant:

ImageSampleInstanceImages::ImageSampleInstanceImages (const vk::DeviceInterface&	vki,
													  vk::VkDevice					device,
													  deUint32						queueFamilyIndex,
													  vk::VkQueue					queue,
													  vk::Allocator&				allocator,
													  vk::VkDescriptorType			descriptorType,
													  ShaderInputInterface			shaderInterface,
													  vk::VkImageViewType			viewType,
													  deUint32						baseMipLevel,
													  deUint32						baseArraySlice,
													  bool							immutable)
	: ImageInstanceImages	(vki,
							 device,
							 queueFamilyIndex,
							 queue,
							 allocator,
							 descriptorType,
							 viewType,
							 getNumImages(descriptorType, shaderInterface),
							 baseMipLevel,
							 baseArraySlice)
	, m_descriptorType		(descriptorType)
	, m_shaderInterface		(shaderInterface)
	, m_isImmutable			(immutable)
	, m_refSamplerA			(createRefSampler(true))
	, m_refSamplerB			(createRefSampler(false))
	, m_samplerA			(createSampler(vki, device, m_refSamplerA, m_imageFormat))
	, m_samplerB			((getInterfaceNumResources(m_shaderInterface) == 1u)
								? vk::Move<vk::VkSampler>()
								: createSampler(vki, device, m_refSamplerB, m_imageFormat))
{
}